

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ioaWriteAig.c
# Opt level: O0

Vec_Int_t * Ioa_WriteAigerLiterals(Aig_Man_t *pMan)

{
  int iVar1;
  int iVar2;
  uint uVar3;
  Vec_Int_t *p;
  Aig_Obj_t *pAVar4;
  Aig_Obj_t *pAVar5;
  int local_2c;
  int i;
  Aig_Obj_t *pDriver;
  Aig_Obj_t *pObj;
  Vec_Int_t *vLits;
  Aig_Man_t *pMan_local;
  
  iVar1 = Aig_ManCoNum(pMan);
  p = Vec_IntAlloc(iVar1);
  local_2c = Aig_ManCoNum(pMan);
  iVar1 = Aig_ManRegNum(pMan);
  for (local_2c = local_2c - iVar1; iVar1 = Vec_PtrSize(pMan->vCos), local_2c < iVar1;
      local_2c = local_2c + 1) {
    pAVar4 = (Aig_Obj_t *)Vec_PtrEntry(pMan->vCos,local_2c);
    pAVar5 = Aig_ObjFanin0(pAVar4);
    iVar1 = Ioa_ObjAigerNum(pAVar5);
    uVar3 = Aig_ObjFaninC0(pAVar4);
    iVar2 = Ioa_ObjAigerNum(pAVar5);
    iVar1 = Ioa_ObjMakeLit(iVar1,uVar3 ^ iVar2 == 0);
    Vec_IntPush(p,iVar1);
  }
  local_2c = 0;
  while( true ) {
    iVar1 = Aig_ManCoNum(pMan);
    iVar2 = Aig_ManRegNum(pMan);
    if (iVar1 - iVar2 <= local_2c) break;
    pAVar4 = (Aig_Obj_t *)Vec_PtrEntry(pMan->vCos,local_2c);
    pAVar5 = Aig_ObjFanin0(pAVar4);
    iVar1 = Ioa_ObjAigerNum(pAVar5);
    uVar3 = Aig_ObjFaninC0(pAVar4);
    iVar2 = Ioa_ObjAigerNum(pAVar5);
    iVar1 = Ioa_ObjMakeLit(iVar1,uVar3 ^ iVar2 == 0);
    Vec_IntPush(p,iVar1);
    local_2c = local_2c + 1;
  }
  return p;
}

Assistant:

Vec_Int_t * Ioa_WriteAigerLiterals( Aig_Man_t * pMan )
{
    Vec_Int_t * vLits;
    Aig_Obj_t * pObj, * pDriver;
    int i;
    vLits = Vec_IntAlloc( Aig_ManCoNum(pMan) );
    Aig_ManForEachLiSeq( pMan, pObj, i )
    {
        pDriver = Aig_ObjFanin0(pObj);
        Vec_IntPush( vLits, Ioa_ObjMakeLit( Ioa_ObjAigerNum(pDriver), Aig_ObjFaninC0(pObj) ^ (Ioa_ObjAigerNum(pDriver) == 0) ) );
    }
    Aig_ManForEachPoSeq( pMan, pObj, i )
    {
        pDriver = Aig_ObjFanin0(pObj);
        Vec_IntPush( vLits, Ioa_ObjMakeLit( Ioa_ObjAigerNum(pDriver), Aig_ObjFaninC0(pObj) ^ (Ioa_ObjAigerNum(pDriver) == 0) ) );
    }
    return vLits;
}